

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O3

void __thiscall
TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOT<double>_>::TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOT<double>_> *this,TPZCompMesh *cmesh)

{
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).field_0x160 = 0x19b71d8
  ;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19b72a0;
  *(undefined4 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).field_0x168 = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).field_0x16c = 1;
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)this,&PTR_construction_vtable_104__019b5e40,cmesh);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).field_0x160 = 0x19b6ca8
  ;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19b6bc8;
  TPZStructMatrixOT<double>::TPZStructMatrixOT
            ((TPZStructMatrixOT<double> *)
             &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).
              super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0,
             &PTR_construction_vtable_104__019b5e68);
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).fActiveEquations.
  _vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).fActiveEquations.fStore =
       (long *)0x0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).fActiveEquations.
  fNElements = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).fActiveEquations.fNAlloc
       = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).fEquationDestination.
  _vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).fEquationDestination.
  fStore = (long *)0x0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).fEquationDestination.
  fNElements = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).fEquationDestination.
  fNAlloc = 0;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).field_0x160 = 0x19b5db8
  ;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19b5be8;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x19b5cb0;
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZCompMesh *cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}